

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOD.h
# Opt level: O3

bool dg::DODRanganath::onallpaths(CDNode *from,CDNode *n,CDGraph *G)

{
  pointer puVar1;
  pointer ppCVar2;
  undefined1 uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  mapped_type *pmVar8;
  key_type pCVar9;
  key_type extraout_RDX;
  byte bVar10;
  CDNode *n_00;
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  CDGraph *in_R8;
  pointer ppCVar11;
  pointer puVar12;
  byte bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  double dVar16;
  unordered_map<dg::CDNode_*,_NodeInf,_std::hash<dg::CDNode_*>,_std::equal_to<dg::CDNode_*>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>_>
  data;
  key_type pCStack_110;
  CDNode *pCStack_108;
  key_type pCStack_100;
  _Rb_tree<dg::CDNode_*,_dg::CDNode_*,_std::_Identity<dg::CDNode_*>,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
  _Stack_f8;
  CDNode *pCStack_c8;
  pointer ppCStack_c0;
  undefined1 local_90 [56];
  _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_58;
  
  if (from == n) {
    uVar3 = 1;
  }
  else {
    local_58._M_buckets = &local_58._M_single_bucket;
    local_58._M_bucket_count = 1;
    local_58._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_58._M_element_count = 0;
    local_58._M_rehash_policy._M_max_load_factor = 1.0;
    local_58._M_rehash_policy._M_next_resize = 0;
    local_58._M_single_bucket = (__node_base_ptr)0x0;
    lVar4 = (long)(G->_nodes).
                  super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(G->_nodes).
                  super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = lVar4 >> 3;
    auVar15._8_4_ = (int)(lVar4 >> 0x23);
    auVar15._0_8_ = lVar5;
    auVar15._12_4_ = 0x45300000;
    dVar16 = (auVar15._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
    uVar6 = (ulong)dVar16;
    pCVar9 = (key_type)((long)uVar6 >> 0x3f);
    this = &local_58;
    local_90._0_8_ = from;
    std::
    _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::rehash(this,(long)(dVar16 - 9.223372036854776e+18) & (ulong)pCVar9 | uVar6);
    ppCVar11 = (pointer)(local_90 + 0x18);
    local_90._48_8_ =
         std::
         _Function_handler<bool_(dg::CDNode_*,_dg::CDNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/lib/ControlDependence/DOD.h:576:17)>
         ::_M_invoke;
    local_90._40_8_ =
         std::
         _Function_handler<bool_(dg::CDNode_*,_dg::CDNode_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mchalupa[P]dg/lib/ControlDependence/DOD.h:576:17)>
         ::_M_manager;
    n_00 = (CDNode *)local_90;
    local_90._24_8_ = this;
    local_90._32_8_ = ppCVar11;
    pmVar7 = std::__detail::
             _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,(key_type *)n_00);
    pmVar7->onstack = true;
    local_90._16_8_ = local_90._0_8_;
    local_90._8_8_ = n;
    if ((pointer)local_90._40_8_ == (pointer)0x0) {
      std::__throw_bad_function_call();
      puVar12 = (in_R8->_nodes).
                super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (in_R8->_nodes).
               super__Vector_base<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>,_std::allocator<std::unique_ptr<dg::CDNode,_std::default_delete<dg::CDNode>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pCStack_110 = extraout_RDX;
      pCStack_100 = pCVar9;
      pCStack_c8 = n;
      ppCStack_c0 = ppCVar11;
      if (puVar12 != puVar1) {
        do {
          _Stack_f8._M_impl._0_8_ =
               (puVar12->_M_t).super___uniq_ptr_impl<dg::CDNode,_std::default_delete<dg::CDNode>_>.
               _M_t.super__Tuple_impl<0UL,_dg::CDNode_*,_std::default_delete<dg::CDNode>_>.
               super__Head_base<0UL,_dg::CDNode_*,_false>._M_head_impl;
          pmVar8 = std::__detail::
                   _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this,(key_type *)&_Stack_f8);
          pmVar8->color = UNCOLORED;
          puVar12 = puVar12 + 1;
        } while (puVar12 != puVar1);
      }
      pmVar8 = std::__detail::
               _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&pCStack_110);
      bVar14 = false;
      pmVar8->color = WHITE;
      pmVar8 = std::__detail::
               _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this,&pCStack_100);
      pmVar8->color = BLACK;
      _Stack_f8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&_Stack_f8 + 8);
      _Stack_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      _Stack_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_f8._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_f8._M_impl.super__Rb_tree_header._M_header._M_left;
      std::
      _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
      ::_M_insert_unique<dg::CDNode*const&>
                ((_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                  *)&_Stack_f8,&pCStack_110);
      std::
      _Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
      ::_M_insert_unique<dg::CDNode*const&>
                ((_Rb_tree<dg::CDNode*,dg::CDNode*,std::_Identity<dg::CDNode*>,std::less<dg::CDNode*>,std::allocator<dg::CDNode*>>
                  *)&_Stack_f8,&pCStack_100);
      coloredDAG((DODRanganath *)this,in_R8,n_00,
                 (set<dg::CDNode_*,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_> *)
                 &_Stack_f8);
      ppCVar11 = (n_00->super_ElemWithEdges<dg::CDNode>)._successors.
                 super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar2 = (n_00->super_ElemWithEdges<dg::CDNode>)._successors.
                super__Vector_base<dg::CDNode_*,_std::allocator<dg::CDNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar11 != ppCVar2) {
        bVar13 = 0;
        bVar10 = 0;
        do {
          pCStack_108 = *ppCVar11;
          pmVar8 = std::__detail::
                   _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this,&pCStack_108);
          bVar13 = bVar13 | pmVar8->color == WHITE;
          pmVar8 = std::__detail::
                   _Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<dg::CDNode_*,_std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>,_std::allocator<std::pair<dg::CDNode_*const,_dg::DODRanganath::Info>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)this,&pCStack_108);
          bVar10 = bVar10 | pmVar8->color == BLACK;
          ppCVar11 = ppCVar11 + 1;
        } while (ppCVar11 != ppCVar2);
        bVar14 = (bool)(bVar13 & bVar10);
      }
      std::
      _Rb_tree<dg::CDNode_*,_dg::CDNode_*,_std::_Identity<dg::CDNode_*>,_std::less<dg::CDNode_*>,_std::allocator<dg::CDNode_*>_>
      ::_M_erase(&_Stack_f8,(_Link_type)_Stack_f8._M_impl.super__Rb_tree_header._M_header._M_parent)
      ;
      return bVar14;
    }
    uVar3 = (*(code *)local_90._48_8_)(local_90 + 0x18,local_90 + 0x10,local_90 + 8);
    if ((pointer)local_90._40_8_ != (pointer)0x0) {
      (*(code *)local_90._40_8_)(local_90 + 0x18,local_90 + 0x18,3);
    }
    std::
    _Hashtable<dg::CDNode_*,_std::pair<dg::CDNode_*const,_NodeInf>,_std::allocator<std::pair<dg::CDNode_*const,_NodeInf>_>,_std::__detail::_Select1st,_std::equal_to<dg::CDNode_*>,_std::hash<dg::CDNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_58);
  }
  return (bool)uVar3;
}

Assistant:

static bool onallpaths(CDNode *from, CDNode *n, CDGraph &G) {
        if (from == n) // fast path
            return true;

        struct NodeInf {
            bool onstack{false};
            bool visited{false};
        };
        std::unordered_map<CDNode *, NodeInf> data;

        data.reserve(G.size());

        const std::function<bool(CDNode *, CDNode *)> onallpths =
                [&](CDNode *node, CDNode *target) -> bool {
            if (node == target)
                return true;

            data[node].visited = true;

            if (!node->hasSuccessors())
                return false;

            for (auto *s : node->successors()) {
                if (data[s].onstack)
                    return false;
                if (!data[s].visited) {
                    data[s].onstack = true;
                    if (!onallpths(s, target))
                        return false;
                    data[s].onstack = false;
                }
            }
            // if we have successors and got here,
            // then all successors reach target
            return true;
        };

        data[from].onstack = true;
        // DBG(tmp, "on all paths:" << from->getID() << ", " << n->getID() << ":
        // " << r );
        return onallpths(from, n);
    }